

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ResultStrAccum(sqlite3_context *pCtx,StrAccum *p)

{
  if (p->accError == 0) {
    if ((p->printfFlags & 4) != 0) {
      sqlite3_result_text(pCtx,p->zText,p->nChar,sqlite3OomClear);
      return;
    }
    sqlite3_result_text(pCtx,"",0,(_func_void_void_ptr *)0x0);
  }
  else {
    sqlite3_result_error_code(pCtx,(uint)p->accError);
  }
  sqlite3_str_reset(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResultStrAccum(sqlite3_context *pCtx, StrAccum *p){
  if( p->accError ){
    sqlite3_result_error_code(pCtx, p->accError);
    sqlite3_str_reset(p);
  }else if( isMalloced(p) ){
    sqlite3_result_text(pCtx, p->zText, p->nChar, SQLITE_DYNAMIC);
  }else{
    sqlite3_result_text(pCtx, "", 0, SQLITE_STATIC);
    sqlite3_str_reset(p);
  }
}